

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int zisofs_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  size_t __size;
  void *pvVar5;
  long lVar6;
  uint32_t bed;
  uint32_t bst;
  int err;
  size_t alloc;
  size_t xsize;
  size_t ceil;
  long lStack_60;
  int r;
  size_t uncompressed_size;
  ssize_t bytes_read;
  size_t avail;
  uchar *p;
  zisofs *zisofs;
  iso9660 *iso9660;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  zisofs = (zisofs *)a->format->data;
  p = (uchar *)&(zisofs->stream).reserved;
  iso9660 = (iso9660 *)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  avail = (size_t)__archive_read_ahead(a,1,(ssize_t *)&uncompressed_size);
  if ((long)uncompressed_size < 1) {
    archive_set_error((archive *)buff_local,0x54,"Truncated zisofs file body");
    return -0x1e;
  }
  if (*(long *)&(zisofs->stream).data_type < (long)uncompressed_size) {
    uncompressed_size = *(size_t *)&(zisofs->stream).data_type;
  }
  bytes_read = uncompressed_size;
  lStack_60 = 0;
  if (*(int *)(p + 0x10) == 0) {
    uVar4 = (((*(long *)(p + 8) + (1L << ((byte)*(undefined4 *)(p + 4) & 0x3f))) - 1U >>
             ((byte)*(undefined4 *)(p + 4) & 0x3f)) + 1) * 4;
    if (*(ulong *)(p + 0x58) < uVar4) {
      if (*(long *)(p + 0x50) != 0) {
        free(*(void **)(p + 0x50));
      }
      __size = ((uVar4 >> 10) + 1) * 0x400;
      pvVar5 = malloc(__size);
      *(void **)(p + 0x50) = pvVar5;
      if (*(long *)(p + 0x50) == 0) {
        archive_set_error((archive *)buff_local,0xc,"No memory for zisofs decompression");
        return -0x1e;
      }
      *(size_t *)(p + 0x58) = __size;
    }
    *(ulong *)(p + 0x60) = uVar4;
    uVar4 = 1L << ((byte)*(undefined4 *)(p + 4) & 0x3f);
    if (*(ulong *)(p + 0x20) < uVar4) {
      if (*(long *)(p + 0x18) != 0) {
        free(*(void **)(p + 0x18));
      }
      pvVar5 = malloc(uVar4);
      *(void **)(p + 0x18) = pvVar5;
      if (*(long *)(p + 0x18) == 0) {
        archive_set_error((archive *)buff_local,0xc,"No memory for zisofs decompression");
        return -0x1e;
      }
    }
    *(ulong *)(p + 0x20) = uVar4;
    if (*(ulong *)(p + 0x40) < 0x10) {
      alloc = 0x10 - *(long *)(p + 0x40);
      if ((ulong)bytes_read < alloc) {
        alloc = bytes_read;
      }
      memcpy(p + *(long *)(p + 0x40) + 0x2c,(void *)avail,alloc);
      *(size_t *)(p + 0x40) = alloc + *(long *)(p + 0x40);
      bytes_read = bytes_read - alloc;
      avail = alloc + avail;
    }
    if ((*(int *)(p + 0x48) == 0) && (*(long *)(p + 0x40) == 0x10)) {
      lVar6 = *(long *)(p + 0x2c);
      uVar1 = archive_le32dec(p + 0x34);
      if ((uint)p[0x39] != *(uint *)(p + 4) ||
          (p[0x38] != '\x04' || ((ulong)uVar1 != *(ulong *)(p + 8) || lVar6 != 0x7d6dbc99653e437)))
      {
        archive_set_error((archive *)buff_local,0x54,"Illegal zisofs file body");
        return -0x1e;
      }
      p[0x48] = '\x01';
      p[0x49] = '\0';
      p[0x4a] = '\0';
      p[0x4b] = '\0';
    }
    if ((*(int *)(p + 0x48) != 0) && (*(ulong *)(p + 0x68) < *(ulong *)(p + 0x60))) {
      alloc = *(long *)(p + 0x60) - *(long *)(p + 0x68);
      if ((ulong)bytes_read < alloc) {
        alloc = bytes_read;
      }
      memcpy((void *)(*(long *)(p + 0x50) + *(long *)(p + 0x68)),(void *)avail,alloc);
      *(size_t *)(p + 0x68) = alloc + *(long *)(p + 0x68);
      bytes_read = bytes_read - alloc;
      avail = alloc + avail;
      if (*(long *)(p + 0x68) == *(long *)(p + 0x60)) {
        p[0x70] = '\0';
        p[0x71] = '\0';
        p[0x72] = '\0';
        p[0x73] = '\0';
        p[0x74] = '\0';
        p[0x75] = '\0';
        p[0x76] = '\0';
        p[0x77] = '\0';
        p[0x78] = '\0';
        p[0x79] = '\0';
        p[0x7a] = '\0';
        p[0x7b] = '\0';
        p[0x10] = '\x01';
        p[0x11] = '\0';
        p[0x12] = '\0';
        p[0x13] = '\0';
      }
    }
    if (*(int *)(p + 0x10) == 0) goto LAB_00668a23;
  }
  if (*(int *)(p + 0x78) == 0) {
    if (*(ulong *)(p + 0x60) <= *(long *)(p + 0x70) + 4U) {
      archive_set_error((archive *)buff_local,0x54,"Illegal zisofs block pointers");
      return -0x1e;
    }
    uVar1 = archive_le32dec((void *)(*(long *)(p + 0x50) + *(long *)(p + 0x70)));
    if ((ulong)uVar1 != (ulong)*(uint *)(p + 0x28) + (uncompressed_size - bytes_read)) {
      archive_set_error((archive *)buff_local,0x54,"Illegal zisofs block pointers(cannot seek)");
      return -0x1e;
    }
    uVar2 = archive_le32dec((void *)(*(long *)(p + 0x50) + *(long *)(p + 0x70) + 4));
    if (uVar2 < uVar1) {
      archive_set_error((archive *)buff_local,0x54,"Illegal zisofs block pointers");
      return -0x1e;
    }
    *(uint32_t *)(p + 0x78) = uVar2 - uVar1;
    *(long *)(p + 0x70) = *(long *)(p + 0x70) + 4;
    if (*(int *)(p + 0xf0) == 0) {
      ceil._4_4_ = cm_zlib_inflateInit_((z_streamp_conflict)(p + 0x80),"1.2.3",0x70);
    }
    else {
      ceil._4_4_ = cm_zlib_inflateReset((z_streamp_conflict)(p + 0x80));
    }
    if (ceil._4_4_ != 0) {
      archive_set_error((archive *)buff_local,-1,"Can\'t initialize zisofs decompression.");
      return -0x1e;
    }
    p[0xf0] = '\x01';
    p[0xf1] = '\0';
    p[0xf2] = '\0';
    p[0xf3] = '\0';
    p[0x90] = '\0';
    p[0x91] = '\0';
    p[0x92] = '\0';
    p[0x93] = '\0';
    p[0x94] = '\0';
    p[0x95] = '\0';
    p[0x96] = '\0';
    p[0x97] = '\0';
    p[0xa8] = '\0';
    p[0xa9] = '\0';
    p[0xaa] = '\0';
    p[0xab] = '\0';
    p[0xac] = '\0';
    p[0xad] = '\0';
    p[0xae] = '\0';
    p[0xaf] = '\0';
  }
  if (*(int *)(p + 0x78) == 0) {
    memset(*(void **)(p + 0x18),0,*(size_t *)(p + 0x20));
    lStack_60 = *(long *)(p + 0x20);
  }
  else {
    *(size_t *)(p + 0x80) = avail;
    if ((ulong)*(uint *)(p + 0x78) < (ulong)bytes_read) {
      *(undefined4 *)(p + 0x88) = *(undefined4 *)(p + 0x78);
    }
    else {
      *(int *)(p + 0x88) = (int)bytes_read;
    }
    *(undefined8 *)(p + 0x98) = *(undefined8 *)(p + 0x18);
    *(undefined4 *)(p + 0xa0) = *(undefined4 *)(p + 0x20);
    uVar3 = cm_zlib_inflate((z_streamp_conflict)(p + 0x80),0);
    if (1 < uVar3) {
      archive_set_error((archive *)buff_local,-1,"zisofs decompression failed (%d)",(ulong)uVar3);
      return -0x1e;
    }
    lStack_60 = *(long *)(p + 0x20) - (ulong)*(uint *)(p + 0xa0);
    bytes_read = bytes_read - (*(long *)(p + 0x80) - avail);
    *(int *)(p + 0x78) = *(int *)(p + 0x78) - ((int)*(undefined8 *)(p + 0x80) - (int)avail);
  }
LAB_00668a23:
  lVar6 = uncompressed_size - bytes_read;
  *size_local = *(size_t *)(p + 0x18);
  *offset_local = lStack_60;
  *(voidpf *)iso9660 = (zisofs->stream).opaque;
  (zisofs->stream).opaque = (voidpf)(lStack_60 + (long)(zisofs->stream).opaque);
  *(long *)&(zisofs->stream).data_type = *(long *)&(zisofs->stream).data_type - lVar6;
  *(long *)&(zisofs->stream).avail_out = lVar6 + *(long *)&(zisofs->stream).avail_out;
  *(int *)(p + 0x28) = (int)lVar6 + *(int *)(p + 0x28);
  (zisofs->stream).adler = lVar6 + (zisofs->stream).adler;
  return 0;
}

Assistant:

static int
zisofs_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct iso9660 *iso9660;
	struct zisofs  *zisofs;
	const unsigned char *p;
	size_t avail;
	ssize_t bytes_read;
	size_t uncompressed_size;
	int r;

	iso9660 = (struct iso9660 *)(a->format->data);
	zisofs = &iso9660->entry_zisofs;

	p = __archive_read_ahead(a, 1, &bytes_read);
	if (bytes_read <= 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated zisofs file body");
		return (ARCHIVE_FATAL);
	}
	if (bytes_read > iso9660->entry_bytes_remaining)
		bytes_read = (ssize_t)iso9660->entry_bytes_remaining;
	avail = bytes_read;
	uncompressed_size = 0;

	if (!zisofs->initialized) {
		size_t ceil, xsize;

		/* Allocate block pointers buffer. */
		ceil = (size_t)((zisofs->pz_uncompressed_size +
			(((int64_t)1) << zisofs->pz_log2_bs) - 1)
			>> zisofs->pz_log2_bs);
		xsize = (ceil + 1) * 4;
		if (zisofs->block_pointers_alloc < xsize) {
			size_t alloc;

			if (zisofs->block_pointers != NULL)
				free(zisofs->block_pointers);
			alloc = ((xsize >> 10) + 1) << 10;
			zisofs->block_pointers = malloc(alloc);
			if (zisofs->block_pointers == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for zisofs decompression");
				return (ARCHIVE_FATAL);
			}
			zisofs->block_pointers_alloc = alloc;
		}
		zisofs->block_pointers_size = xsize;

		/* Allocate uncompressed data buffer. */
		xsize = (size_t)1UL << zisofs->pz_log2_bs;
		if (zisofs->uncompressed_buffer_size < xsize) {
			if (zisofs->uncompressed_buffer != NULL)
				free(zisofs->uncompressed_buffer);
			zisofs->uncompressed_buffer = malloc(xsize);
			if (zisofs->uncompressed_buffer == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for zisofs decompression");
				return (ARCHIVE_FATAL);
			}
		}
		zisofs->uncompressed_buffer_size = xsize;

		/*
		 * Read the file header, and check the magic code of zisofs.
		 */
		if (zisofs->header_avail < sizeof(zisofs->header)) {
			xsize = sizeof(zisofs->header) - zisofs->header_avail;
			if (avail < xsize)
				xsize = avail;
			memcpy(zisofs->header + zisofs->header_avail, p, xsize);
			zisofs->header_avail += xsize;
			avail -= xsize;
			p += xsize;
		}
		if (!zisofs->header_passed &&
		    zisofs->header_avail == sizeof(zisofs->header)) {
			int err = 0;

			if (memcmp(zisofs->header, zisofs_magic,
			    sizeof(zisofs_magic)) != 0)
				err = 1;
			if (archive_le32dec(zisofs->header + 8)
			    != zisofs->pz_uncompressed_size)
				err = 1;
			if (zisofs->header[12] != 4)
				err = 1;
			if (zisofs->header[13] != zisofs->pz_log2_bs)
				err = 1;
			if (err) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Illegal zisofs file body");
				return (ARCHIVE_FATAL);
			}
			zisofs->header_passed = 1;
		}
		/*
		 * Read block pointers.
		 */
		if (zisofs->header_passed &&
		    zisofs->block_pointers_avail < zisofs->block_pointers_size) {
			xsize = zisofs->block_pointers_size
			    - zisofs->block_pointers_avail;
			if (avail < xsize)
				xsize = avail;
			memcpy(zisofs->block_pointers
			    + zisofs->block_pointers_avail, p, xsize);
			zisofs->block_pointers_avail += xsize;
			avail -= xsize;
			p += xsize;
		    	if (zisofs->block_pointers_avail
			    == zisofs->block_pointers_size) {
				/* We've got all block pointers and initialize
				 * related variables.	*/
				zisofs->block_off = 0;
				zisofs->block_avail = 0;
				/* Complete a initialization */
				zisofs->initialized = 1;
			}
		}

		if (!zisofs->initialized)
			goto next_data; /* We need more data. */
	}

	/*
	 * Get block offsets from block pointers.
	 */
	if (zisofs->block_avail == 0) {
		uint32_t bst, bed;

		if (zisofs->block_off + 4 >= zisofs->block_pointers_size) {
			/* There isn't a pair of offsets. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs block pointers");
			return (ARCHIVE_FATAL);
		}
		bst = archive_le32dec(
		    zisofs->block_pointers + zisofs->block_off);
		if (bst != zisofs->pz_offset + (bytes_read - avail)) {
			/* TODO: Should we seek offset of current file
			 * by bst ? */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs block pointers(cannot seek)");
			return (ARCHIVE_FATAL);
		}
		bed = archive_le32dec(
		    zisofs->block_pointers + zisofs->block_off + 4);
		if (bed < bst) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs block pointers");
			return (ARCHIVE_FATAL);
		}
		zisofs->block_avail = bed - bst;
		zisofs->block_off += 4;

		/* Initialize compression library for new block. */
		if (zisofs->stream_valid)
			r = inflateReset(&zisofs->stream);
		else
			r = inflateInit(&zisofs->stream);
		if (r != Z_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Can't initialize zisofs decompression.");
			return (ARCHIVE_FATAL);
		}
		zisofs->stream_valid = 1;
		zisofs->stream.total_in = 0;
		zisofs->stream.total_out = 0;
	}

	/*
	 * Make uncompressed data.
	 */
	if (zisofs->block_avail == 0) {
		memset(zisofs->uncompressed_buffer, 0,
		    zisofs->uncompressed_buffer_size);
		uncompressed_size = zisofs->uncompressed_buffer_size;
	} else {
		zisofs->stream.next_in = (Bytef *)(uintptr_t)(const void *)p;
		if (avail > zisofs->block_avail)
			zisofs->stream.avail_in = zisofs->block_avail;
		else
			zisofs->stream.avail_in = (uInt)avail;
		zisofs->stream.next_out = zisofs->uncompressed_buffer;
		zisofs->stream.avail_out =
		    (uInt)zisofs->uncompressed_buffer_size;

		r = inflate(&zisofs->stream, 0);
		switch (r) {
		case Z_OK: /* Decompressor made some progress.*/
		case Z_STREAM_END: /* Found end of stream. */
			break;
		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "zisofs decompression failed (%d)", r);
			return (ARCHIVE_FATAL);
		}
		uncompressed_size =
		    zisofs->uncompressed_buffer_size - zisofs->stream.avail_out;
		avail -= zisofs->stream.next_in - p;
		zisofs->block_avail -= (uint32_t)(zisofs->stream.next_in - p);
	}
next_data:
	bytes_read -= avail;
	*buff = zisofs->uncompressed_buffer;
	*size = uncompressed_size;
	*offset = iso9660->entry_sparse_offset;
	iso9660->entry_sparse_offset += uncompressed_size;
	iso9660->entry_bytes_remaining -= bytes_read;
	iso9660->current_position += bytes_read;
	zisofs->pz_offset += (uint32_t)bytes_read;
	iso9660->entry_bytes_unconsumed += bytes_read;

	return (ARCHIVE_OK);
}